

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTruth.c
# Opt level: O3

word * Gia_ObjComputeTruthTable(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  Gia_Obj_t *pObj_00;
  Gia_Obj_t *pGVar1;
  Gia_Obj_t *pGVar2;
  ulong *puVar3;
  ulong *puVar4;
  undefined4 uVar5;
  void *pvVar6;
  Gia_Obj_t *pGVar7;
  Gia_Obj_t *pGVar8;
  undefined8 uVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  int iVar14;
  Vec_Int_t *pVVar15;
  int *piVar16;
  Vec_Int_t *pVVar17;
  void **ppvVar18;
  Vec_Ptr_t *pVVar19;
  Vec_Wrd_t *pVVar20;
  word *pwVar21;
  ulong uVar22;
  long lVar23;
  word *pwVar24;
  uint uVar25;
  uint uVar26;
  int iVar27;
  uint uVar28;
  ulong uVar29;
  long lVar30;
  ulong uVar31;
  word *pwVar32;
  int iVar33;
  ulong uVar34;
  size_t __size;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  int iVar39;
  undefined1 auVar38 [16];
  
  if (p->vTtMemory == (Vec_Wrd_t *)0x0) {
    uVar28 = p->vCis->nSize - p->nRegs;
    p->nTtVars = uVar28;
    iVar14 = 1 << ((char)uVar28 - 6U & 0x1f);
    if ((int)uVar28 < 7) {
      iVar14 = 1;
    }
    p->nTtWords = iVar14;
    iVar14 = p->nObjs;
    lVar23 = (long)iVar14 + 1000;
    pVVar15 = (Vec_Int_t *)malloc(0x10);
    iVar33 = (int)lVar23;
    iVar27 = 0x10;
    if (0xe < iVar14 + 999U) {
      iVar27 = iVar33;
    }
    pVVar15->nCap = iVar27;
    if (iVar27 == 0) {
      piVar16 = (int *)0x0;
    }
    else {
      piVar16 = (int *)malloc((long)iVar27 << 2);
    }
    pVVar15->pArray = piVar16;
    pVVar15->nSize = iVar33;
    uVar22 = 0;
    memset(piVar16,0,lVar23 * 4);
    p->vTtNums = pVVar15;
    pVVar17 = (Vec_Int_t *)malloc(0x10);
    pVVar17->nCap = 0x100;
    pVVar17->nSize = 0;
    piVar16 = (int *)malloc(0x400);
    pVVar17->pArray = piVar16;
    p->vTtNodes = pVVar17;
    uVar34 = 6;
    if (6 < (int)uVar28) {
      uVar34 = (ulong)uVar28;
    }
    iVar14 = (int)uVar34;
    iVar27 = iVar14 + -5;
    uVar28 = 1 << ((byte)iVar27 & 0x1f);
    ppvVar18 = (void **)malloc(((long)(int)uVar28 * 4 + 8) * uVar34);
    lVar23 = uVar34 * 8;
    do {
      ppvVar18[uVar22] = (void *)((long)ppvVar18 + lVar23);
      uVar22 = uVar22 + 1;
      lVar23 = lVar23 + (long)(int)uVar28 * 4;
    } while (uVar34 != uVar22);
    pVVar19 = (Vec_Ptr_t *)malloc(0x10);
    pVVar19->nSize = iVar14;
    pVVar19->nCap = iVar14;
    pVVar19->pArray = ppvVar18;
    auVar13 = _DAT_008403e0;
    auVar12 = _DAT_008403d0;
    auVar11 = _DAT_008403c0;
    uVar22 = (ulong)uVar28;
    lVar23 = uVar22 - 1;
    auVar35._8_4_ = (int)lVar23;
    auVar35._0_8_ = lVar23;
    auVar35._12_4_ = (int)((ulong)lVar23 >> 0x20);
    uVar29 = 0;
    auVar35 = auVar35 ^ _DAT_008403e0;
    do {
      pvVar6 = ppvVar18[uVar29];
      iVar14 = auVar35._0_4_;
      iVar33 = auVar35._4_4_;
      if (uVar29 < 5) {
        if (iVar27 != 0x1f) {
          uVar5 = (&DAT_00999ca0)[uVar29];
          uVar31 = 0;
          auVar36 = auVar12;
          auVar37 = auVar11;
          do {
            auVar38 = auVar36 ^ auVar13;
            if ((bool)(~(auVar38._4_4_ == iVar33 && iVar14 < auVar38._0_4_ || iVar33 < auVar38._4_4_
                        ) & 1)) {
              *(undefined4 *)((long)pvVar6 + uVar31 * 4) = uVar5;
            }
            if ((auVar38._12_4_ != auVar35._12_4_ || auVar38._8_4_ <= auVar35._8_4_) &&
                auVar38._12_4_ <= auVar35._12_4_) {
              *(undefined4 *)((long)pvVar6 + uVar31 * 4 + 4) = uVar5;
            }
            iVar39 = SUB164(auVar37 ^ auVar13,4);
            if (iVar39 <= iVar33 && (iVar39 != iVar33 || SUB164(auVar37 ^ auVar13,0) <= iVar14)) {
              *(undefined4 *)((long)pvVar6 + uVar31 * 4 + 8) = uVar5;
              *(undefined4 *)((long)pvVar6 + uVar31 * 4 + 0xc) = uVar5;
            }
            uVar31 = uVar31 + 4;
            lVar23 = auVar36._8_8_;
            auVar36._0_8_ = auVar36._0_8_ + 4;
            auVar36._8_8_ = lVar23 + 4;
            lVar23 = auVar37._8_8_;
            auVar37._0_8_ = auVar37._0_8_ + 4;
            auVar37._8_8_ = lVar23 + 4;
          } while ((uVar22 + 3 & 0xfffffffffffffffc) != uVar31);
        }
      }
      else if (iVar27 != 0x1f) {
        uVar28 = 1 << ((char)uVar29 - 5U & 0x1f);
        uVar31 = 0;
        auVar38 = auVar12;
        do {
          bVar10 = iVar14 < SUB164(auVar38 ^ auVar13,0);
          iVar39 = SUB164(auVar38 ^ auVar13,4);
          if ((bool)(~(iVar33 < iVar39 || iVar39 == iVar33 && bVar10) & 1)) {
            *(uint *)((long)pvVar6 + uVar31 * 4) = -(uint)((uVar28 & (uint)uVar31) != 0);
          }
          if (iVar33 >= iVar39 && (iVar39 != iVar33 || !bVar10)) {
            *(uint *)((long)pvVar6 + uVar31 * 4 + 4) = -(uint)(((uint)uVar31 + 1 & uVar28) != 0);
          }
          uVar31 = uVar31 + 2;
          lVar23 = auVar38._8_8_;
          auVar38._0_8_ = auVar38._0_8_ + 2;
          auVar38._8_8_ = lVar23 + 2;
        } while ((uVar22 + 1 & 0x1fffffffe) != uVar31);
      }
      uVar29 = uVar29 + 1;
    } while (uVar29 != uVar34);
    p->vTtInputs = pVVar19;
    lVar23 = (long)p->nTtWords;
    pVVar20 = (Vec_Wrd_t *)malloc(0x10);
    iVar14 = (int)(lVar23 << 8);
    pVVar20->nCap = iVar14;
    if (lVar23 == 0) {
      __size = 0;
      pwVar21 = (word *)0x0;
    }
    else {
      __size = lVar23 << 0xb;
      pwVar21 = (word *)malloc(__size);
    }
    pVVar20->pArray = pwVar21;
    pVVar20->nSize = iVar14;
    memset(pwVar21,0,__size);
    p->vTtMemory = pVVar20;
  }
  else {
    if (p->nTtVars != p->vCis->nSize - p->nRegs) {
      __assert_fail("p->nTtVars == Gia_ManPiNum(p)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaTruth.c"
                    ,0xf1,"word *Gia_ObjComputeTruthTable(Gia_Man_t *, Gia_Obj_t *)");
    }
    pVVar15 = p->vTtNums;
  }
  if (pVVar15->nSize < p->nObjs) {
    Vec_IntFillExtra(pVVar15,p->nObjs,0);
  }
  uVar22 = *(ulong *)pObj & 0x1fffffff;
  uVar34 = 0;
  if (uVar22 != 0x1fffffff) {
    uVar34 = -uVar22;
  }
  pObj_00 = pObj + (uVar34 & (long)(int)*(ulong *)pObj >> 0x1f);
  p->vTtNodes->nSize = 0;
  Gia_ObjCollectInternal_rec(p,pObj_00);
  pVVar15 = p->vTtNodes;
  iVar14 = pVVar15->nSize;
  iVar27 = (iVar14 + 2) * p->nTtWords;
  if (p->vTtMemory->nSize < iVar27) {
    Vec_WrdFillExtra(p->vTtMemory,iVar27,(word)pVVar15);
    pVVar15 = p->vTtNodes;
    iVar14 = pVVar15->nSize;
  }
  if (0 < iVar14) {
    lVar23 = 0;
    do {
      iVar14 = pVVar15->pArray[lVar23];
      if (((long)iVar14 < 0) || (p->nObjs <= iVar14)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar8 = p->pObjs + iVar14;
      uVar34 = *(ulong *)pGVar8;
      *(ulong *)pGVar8 = uVar34 & 0xffffffffbfffffff;
      pGVar7 = p->pObjs;
      if ((pGVar8 < pGVar7) || (pGVar1 = pGVar7 + p->nObjs, pGVar1 <= pGVar8)) goto LAB_00788e26;
      uVar28 = (int)((long)pGVar8 - (long)pGVar7 >> 2) * -0x55555555;
      if ((int)uVar28 < 0) goto LAB_00788e45;
      uVar25 = p->vTtNums->nSize;
      if ((int)uVar25 <= (int)uVar28) goto LAB_00788e45;
      pwVar21 = p->vTtMemory->pArray;
      iVar14 = p->nTtWords;
      lVar30 = (long)iVar14;
      piVar16 = p->vTtNums->pArray;
      iVar27 = piVar16[uVar28 & 0x7fffffff] * iVar14;
      uVar22 = (ulong)((uint)uVar34 & 0x1fffffff);
      uVar28 = (uint)*(undefined8 *)(pGVar8 + -uVar22);
      if ((~uVar28 & 0x1fffffff) == 0 || (int)uVar28 < 0) {
        if (-1 < (int)uVar28) goto LAB_00788ea2;
        uVar28 = (uint)((ulong)*(undefined8 *)(pGVar8 + -uVar22) >> 0x20);
        if (p->vTtInputs->nSize <= (int)(uVar28 & 0x1fffffff)) goto LAB_00788e83;
        pwVar24 = *(word **)((long)p->vTtInputs->pArray + (ulong)(uVar28 << 3));
      }
      else {
        pGVar2 = pGVar8 + -uVar22;
        if ((pGVar2 < pGVar7) || (pGVar1 <= pGVar2)) goto LAB_00788e26;
        uVar28 = (int)((long)pGVar2 - (long)pGVar7 >> 2) * -0x55555555;
        if (((int)uVar28 < 0) || (uVar25 <= uVar28)) goto LAB_00788e45;
        pwVar24 = pwVar21 + piVar16[uVar28 & 0x7fffffff] * lVar30;
      }
      uVar22 = (ulong)((uint)(uVar34 >> 0x20) & 0x1fffffff);
      uVar28 = (uint)*(undefined8 *)(pGVar8 + -uVar22);
      if ((~uVar28 & 0x1fffffff) == 0 || (int)uVar28 < 0) {
        if (-1 < (int)uVar28) {
LAB_00788ea2:
          __assert_fail("pObj->fTerm",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                        ,0x1b8,"int Gia_ObjCioId(Gia_Obj_t *)");
        }
        uVar28 = (uint)((ulong)*(undefined8 *)(pGVar8 + -uVar22) >> 0x20);
        if (p->vTtInputs->nSize <= (int)(uVar28 & 0x1fffffff)) goto LAB_00788e83;
        pwVar32 = *(word **)((long)p->vTtInputs->pArray + (ulong)(uVar28 << 3));
      }
      else {
        pGVar8 = pGVar8 + -uVar22;
        if ((pGVar8 < pGVar7) || (pGVar1 <= pGVar8)) goto LAB_00788e26;
        uVar28 = (int)((long)pGVar8 - (long)pGVar7 >> 2) * -0x55555555;
        if (((int)uVar28 < 0) || (uVar25 <= uVar28)) goto LAB_00788e45;
        pwVar32 = pwVar21 + piVar16[uVar28 & 0x7fffffff] * lVar30;
      }
      puVar3 = pwVar21 + iVar27 + lVar30;
      if (((uint)uVar34 >> 0x1d & 1) == 0) {
        if ((uVar34 >> 0x3d & 1) == 0) {
          if (0 < iVar14) {
            lVar30 = 0;
            do {
              puVar4 = (ulong *)((long)pwVar21 + lVar30 + (long)iVar27 * 8);
              *puVar4 = *(ulong *)((long)pwVar32 + lVar30) & *(ulong *)((long)pwVar24 + lVar30);
              lVar30 = lVar30 + 8;
            } while (puVar4 + 1 < puVar3);
          }
        }
        else if (0 < iVar14) {
          lVar30 = 0;
          do {
            puVar4 = (ulong *)((long)pwVar21 + lVar30 + (long)iVar27 * 8);
            *puVar4 = ~*(ulong *)((long)pwVar32 + lVar30) & *(ulong *)((long)pwVar24 + lVar30);
            lVar30 = lVar30 + 8;
          } while (puVar4 + 1 < puVar3);
        }
      }
      else if ((uVar34 >> 0x3d & 1) == 0) {
        if (0 < iVar14) {
          lVar30 = 0;
          do {
            puVar4 = (ulong *)((long)pwVar21 + lVar30 + (long)iVar27 * 8);
            *puVar4 = ~*(ulong *)((long)pwVar24 + lVar30) & *(ulong *)((long)pwVar32 + lVar30);
            lVar30 = lVar30 + 8;
          } while (puVar4 + 1 < puVar3);
        }
      }
      else if (0 < iVar14) {
        lVar30 = 0;
        do {
          puVar4 = (ulong *)((long)pwVar21 + lVar30 + (long)iVar27 * 8);
          *puVar4 = ~(*(ulong *)((long)pwVar32 + lVar30) | *(ulong *)((long)pwVar24 + lVar30));
          lVar30 = lVar30 + 8;
        } while (puVar4 + 1 < puVar3);
      }
      lVar23 = lVar23 + 1;
      pVVar15 = p->vTtNodes;
    } while (lVar23 < pVVar15->nSize);
  }
  uVar34 = *(ulong *)pObj_00;
  if ((~uVar34 & 0x1fffffff1fffffff) == 0) {
    uVar34 = (ulong)p->nTtWords;
    pVVar20 = p->vTtMemory;
    if ((long)uVar34 < 1) {
      return pVVar20->pArray + (long)pVVar20->nSize + uVar34 * -2;
    }
    uVar22 = (ulong)(uint)p->nTtWords;
    pwVar21 = pVVar20->pArray + ((long)pVVar20->nSize - uVar22);
    memset(pwVar21,0,uVar22 * 8);
    pwVar24 = pVVar20->pArray + (long)pVVar20->nSize + uVar22 * -2;
    goto LAB_00788dd6;
  }
  uVar28 = (uint)uVar34;
  if ((~uVar28 & 0x9fffffff) == 0) {
    uVar25 = (uint)(uVar34 >> 0x20);
    uVar26 = uVar25 & 0x1fffffff;
    if (p->vCis->nSize - p->nRegs <= (int)uVar26) goto LAB_00788d0b;
    if (p->vTtInputs->nSize <= (int)uVar26) {
LAB_00788e83:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    pwVar21 = *(word **)((long)p->vTtInputs->pArray + (ulong)(uVar25 << 3));
    uVar34 = (ulong)(uint)p->nTtWords;
    pVVar20 = p->vTtMemory;
  }
  else {
LAB_00788d0b:
    uVar34 = (ulong)(uint)p->nTtWords;
    pVVar20 = p->vTtMemory;
    if ((~uVar28 & 0x1fffffff) == 0 || (int)uVar28 < 0) {
      pwVar21 = (word *)0x0;
    }
    else {
      pGVar8 = p->pObjs;
      if ((pObj_00 < pGVar8) || (pGVar8 + p->nObjs <= pObj_00)) {
LAB_00788e26:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      uVar28 = (int)((long)pObj_00 - (long)pGVar8 >> 2) * -0x55555555;
      if (((int)uVar28 < 0) || (p->vTtNums->nSize <= (int)uVar28)) {
LAB_00788e45:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      pwVar21 = pVVar20->pArray + (long)p->vTtNums->pArray[uVar28 & 0x7fffffff] * (long)p->nTtWords;
    }
  }
  pwVar24 = pVVar20->pArray + ((long)pVVar20->nSize - (long)((int)uVar34 * 2));
  if ((int)uVar34 < 1) {
    return pwVar24;
  }
LAB_00788dd6:
  uVar9 = *(undefined8 *)pObj;
  uVar28 = (uint)uVar9;
  uVar22 = 0;
  do {
    pwVar24[uVar22] =
         pwVar21[uVar22] ^
         -(ulong)((byte)((ulong)uVar9 >> 0x18) >> 5 & (int)uVar28 < 0 & (~uVar28 & 0x1fffffff) != 0)
    ;
    uVar22 = uVar22 + 1;
  } while ((uVar34 & 0xffffffff) != uVar22);
  return pwVar24;
}

Assistant:

word * Gia_ObjComputeTruthTable( Gia_Man_t * p, Gia_Obj_t * pObj )
{
    Gia_Obj_t * pTemp, * pRoot;
    word * pTruth, * pTruthL, * pTruth0, * pTruth1;
    int i;
    if ( p->vTtMemory == NULL )
    {
        p->nTtVars   = Gia_ManPiNum( p );
        p->nTtWords  = Abc_Truth6WordNum( p->nTtVars );
        p->vTtNums   = Vec_IntStart( Gia_ManObjNum(p) + 1000 );
        p->vTtNodes  = Vec_IntAlloc( 256 );
        p->vTtInputs = Vec_PtrAllocTruthTables( Abc_MaxInt(6, p->nTtVars) );
        p->vTtMemory = Vec_WrdStart( p->nTtWords * 256 );
    }
    else
    {
        // make sure the number of primary inputs did not change 
        // since the truth table computation storage was prepared
        assert( p->nTtVars == Gia_ManPiNum(p) );
    }
    // extend ID numbers
    if ( Vec_IntSize(p->vTtNums) < Gia_ManObjNum(p) )
        Vec_IntFillExtra( p->vTtNums, Gia_ManObjNum(p), 0 );
    // collect internal nodes
    pRoot = Gia_ObjIsCo(pObj) ? Gia_ObjFanin0(pObj) : pObj;
    Gia_ObjCollectInternal( p, pRoot );
    // extend TT storage
    if ( Vec_WrdSize(p->vTtMemory) < p->nTtWords * (Vec_IntSize(p->vTtNodes) + 2) )
        Vec_WrdFillExtra( p->vTtMemory, p->nTtWords * (Vec_IntSize(p->vTtNodes) + 2), 0 );
    // compute the truth table for internal nodes
    Gia_ManForEachObjVec( p->vTtNodes, p, pTemp, i )
    {
        pTemp->fMark0 = 0; // unmark nodes marked by Gia_ObjCollectInternal()
        pTruth  = Gla_ObjTruthNode(p, pTemp);
        pTruthL = pTruth + p->nTtWords;
        pTruth0 = Gia_ObjIsAnd(Gia_ObjFanin0(pTemp)) ? Gla_ObjTruthNode(p, Gia_ObjFanin0(pTemp)) : Gla_ObjTruthElem(p, Gia_ObjCioId(Gia_ObjFanin0(pTemp)) );
        pTruth1 = Gia_ObjIsAnd(Gia_ObjFanin1(pTemp)) ? Gla_ObjTruthNode(p, Gia_ObjFanin1(pTemp)) : Gla_ObjTruthElem(p, Gia_ObjCioId(Gia_ObjFanin1(pTemp)) );
        if ( Gia_ObjFaninC0(pTemp) )
        {
            if ( Gia_ObjFaninC1(pTemp) )
                while ( pTruth < pTruthL )
                    *pTruth++ = ~*pTruth0++ & ~*pTruth1++;
            else
                while ( pTruth < pTruthL )
                    *pTruth++ = ~*pTruth0++ &  *pTruth1++;
        }
        else
        {
            if ( Gia_ObjFaninC1(pTemp) )
                while ( pTruth < pTruthL )
                    *pTruth++ =  *pTruth0++ & ~*pTruth1++;
            else
                while ( pTruth < pTruthL )
                    *pTruth++ =  *pTruth0++ &  *pTruth1++;
        }
    }
    // compute the final table
    if ( Gia_ObjIsConst0(pRoot) )
        pTruth = Gla_ObjTruthConst0( p, Gla_ObjTruthFree1(p) );
    else if ( Gia_ObjIsPi(p, pRoot) )
        pTruth = Gla_ObjTruthElem( p, Gia_ObjCioId(pRoot) );
    else if ( Gia_ObjIsAnd(pRoot) )
        pTruth = Gla_ObjTruthNode( p, pRoot );
    else
        pTruth = NULL;
    return Gla_ObjTruthDup( p, Gla_ObjTruthFree2(p), pTruth, Gia_ObjIsCo(pObj) && Gia_ObjFaninC0(pObj) );
}